

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O2

void __thiscall
CorUnix::CPalSynchronizationManager::FreeObjectSynchData
          (CPalSynchronizationManager *this,CObjectType *potObjectType,ObjectDomain odObjectDomain,
          VOID *pvSynchData)

{
  CPalThread *pthrCurrent;
  
  pthrCurrent = InternalGetCurrentThread();
  if (odObjectDomain == SharedObject) {
    pvSynchData = SHMPtrToPtr((SHMPTR)pvSynchData);
    if ((CSynchData *)pvSynchData == (CSynchData *)0x0) {
      fprintf(_stderr,"] %s %s:%d","FreeObjectSynchData",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
              ,0x455);
      fprintf(_stderr,"Bad shared memory pointer\n");
      return;
    }
  }
  CSynchData::Release((CSynchData *)pvSynchData,pthrCurrent);
  return;
}

Assistant:

void CPalSynchronizationManager::FreeObjectSynchData(
        CObjectType *potObjectType,
        ObjectDomain odObjectDomain,
        VOID *pvSynchData)
    {
        CSynchData * psdSynchData;
        CPalThread * pthrCurrent = InternalGetCurrentThread();

        if (odObjectDomain == SharedObject)
        {
            psdSynchData = SharedIDToTypePointer(CSynchData,
                reinterpret_cast<SharedID>(pvSynchData));
            if (NULL == psdSynchData)
            {
                ASSERT("Bad shared memory pointer\n");
                goto FOSD_exit;
            }
        }
        else
        {
            psdSynchData = static_cast<CSynchData *>(pvSynchData);
        }

        psdSynchData->Release(pthrCurrent);

    FOSD_exit:
        return;
    }